

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeGetAttrValue(xmlNode *node,xmlChar *name,xmlChar *nsUri,xmlChar **out)

{
  xmlAttrPtr prop_00;
  xmlChar *pxVar1;
  xmlAttrPtr prop;
  xmlChar **out_local;
  xmlChar *nsUri_local;
  xmlChar *name_local;
  xmlNode *node_local;
  
  if (out == (xmlChar **)0x0) {
    node_local._4_4_ = 1;
  }
  else {
    *out = (xmlChar *)0x0;
    prop_00 = xmlGetPropNodeInternal(node,name,nsUri,0);
    if (prop_00 == (xmlAttrPtr)0x0) {
      node_local._4_4_ = 1;
    }
    else {
      pxVar1 = xmlGetPropNodeValueInternal(prop_00);
      *out = pxVar1;
      if (*out == (xmlChar *)0x0) {
        node_local._4_4_ = -1;
      }
      else {
        node_local._4_4_ = 0;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

int
xmlNodeGetAttrValue(const xmlNode *node, const xmlChar *name,
                    const xmlChar *nsUri, xmlChar **out) {
    xmlAttrPtr prop;

    if (out == NULL)
        return(1);
    *out = NULL;

    prop = xmlGetPropNodeInternal(node, name, nsUri, 0);
    if (prop == NULL)
	return(1);

    *out = xmlGetPropNodeValueInternal(prop);
    if (*out == NULL)
        return(-1);
    return(0);
}